

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::BlendFactorForSide<double>
               (int *side,TPZVec<double> *xiVec,double *blendFactor,TPZVec<double> *blendFactorDxi)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  (*blendFactorDxi->_vptr_TPZVec[2])(blendFactorDxi,3);
  *blendFactor = 0.0;
  GetTolerance();
  bVar1 = CheckProjectionForSingularity<double>(side,xiVec);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Side projection is not regular and it should have been checked earlier. Aborting.."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
               ,0x17e);
  }
  (*blendFactorDxi->_vptr_TPZVec[2])(blendFactorDxi,3);
  if (0x13 < (uint)*side) {
    return;
  }
  pdVar3 = xiVec->fStore;
  switch(*side) {
  default:
    *blendFactor = 0.0;
    return;
  case 6:
    *blendFactor = (1.0 - pdVar3[2]) * 0.5 * (1.0 - pdVar3[1]) * (1.0 - pdVar3[1]);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = 0.0;
    pdVar4[1] = (1.0 - pdVar3[2]) * -(1.0 - pdVar3[1]);
    dVar5 = 1.0 - pdVar3[1];
    goto LAB_00e00a35;
  case 7:
    *blendFactor = (1.0 - pdVar3[2]) * 0.5 * (*pdVar3 + pdVar3[1]) * (*pdVar3 + pdVar3[1]);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = (1.0 - pdVar3[2]) * (pdVar3[1] + *pdVar3);
    pdVar4[1] = (1.0 - pdVar3[2]) * (pdVar3[1] + *pdVar3);
    dVar5 = pdVar3[1] + *pdVar3;
    goto LAB_00e00a35;
  case 8:
    *blendFactor = (1.0 - pdVar3[2]) * 0.5 * (1.0 - *pdVar3) * (1.0 - *pdVar3);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = (1.0 - pdVar3[2]) * -(1.0 - *pdVar3);
    pdVar4[1] = 0.0;
    dVar5 = 1.0 - *pdVar3;
LAB_00e00a35:
    dVar5 = dVar5 * dVar5 * -0.5;
LAB_00e00af4:
    pdVar4[2] = dVar5;
    return;
  case 9:
    *blendFactor = (1.0 - *pdVar3) - pdVar3[1];
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = -1.0;
    dVar6 = -1.0;
    break;
  case 10:
    *blendFactor = *pdVar3;
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = 1.0;
    goto LAB_00e0094f;
  case 0xb:
    *blendFactor = pdVar3[1];
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = 0.0;
    dVar6 = 1.0;
    break;
  case 0xc:
    *blendFactor = (pdVar3[2] + 1.0) * 0.5 * (1.0 - pdVar3[1]) * (1.0 - pdVar3[1]);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = 0.0;
    pdVar4[1] = (pdVar3[2] + 1.0) * -(1.0 - pdVar3[1]);
    dVar5 = pdVar3[1];
    goto LAB_00e00aec;
  case 0xd:
    *blendFactor = (pdVar3[2] + 1.0) * 0.5 * (*pdVar3 + pdVar3[1]) * (*pdVar3 + pdVar3[1]);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = (pdVar3[2] + 1.0) * (pdVar3[1] + *pdVar3);
    pdVar4[1] = (pdVar3[2] + 1.0) * (pdVar3[1] + *pdVar3);
    pdVar4[2] = (pdVar3[1] + *pdVar3) * (pdVar3[1] + *pdVar3) * 0.5;
    return;
  case 0xe:
    *blendFactor = (pdVar3[2] + 1.0) * 0.5 * (1.0 - *pdVar3) * (1.0 - *pdVar3);
    pdVar4 = blendFactorDxi->fStore;
    *pdVar4 = (pdVar3[2] + 1.0) * -(1.0 - *pdVar3);
    pdVar4[1] = 0.0;
    dVar5 = *pdVar3;
LAB_00e00aec:
    dVar5 = (1.0 - dVar5) * (1.0 - dVar5) * 0.5;
    goto LAB_00e00af4;
  case 0xf:
    *blendFactor = (1.0 - pdVar3[2]) * 0.5;
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    dVar5 = -0.5;
    goto LAB_00e00b2b;
  case 0x10:
    *blendFactor = 1.0 - pdVar3[1];
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = 0.0;
    dVar6 = -1.0;
    break;
  case 0x11:
    *blendFactor = *pdVar3 + pdVar3[1];
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = 1.0;
    dVar6 = 1.0;
    break;
  case 0x12:
    *blendFactor = 1.0 - *pdVar3;
    pdVar3 = blendFactorDxi->fStore;
    dVar5 = -1.0;
LAB_00e0094f:
    *pdVar3 = dVar5;
    pdVar3[1] = 0.0;
    pdVar3[2] = 0.0;
    return;
  case 0x13:
    *blendFactor = (pdVar3[2] + 1.0) * 0.5;
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    dVar5 = 0.5;
LAB_00e00b2b:
    pdVar3[2] = dVar5;
    return;
  }
  *pdVar3 = dVar5;
  pdVar3[1] = dVar6;
  pdVar3[2] = 0.0;
  return;
}

Assistant:

void TPZPrism::BlendFactorForSide(const int &side, const TPZVec<T> &xiVec, T &blendFactor,
                                        TPZVec<T> &blendFactorDxi){
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        blendFactor = 0;
        const REAL tol = pztopology::GetTolerance();
        #ifdef PZDEBUG
        std::ostringstream sout;
        if(side < NCornerNodes || side >= NSides){
            sout<<"The side\t"<<side<<"is invalid. Aborting..."<<std::endl;
        }

        if(!pztopology::TPZPrism::IsInParametricDomain(xiVec,tol)){
            sout<<"The method BlendFactorForSide expects the point xi to correspond to coordinates of a point";
            sout<<" inside the parametric domain. Aborting...";
        }

        if(!sout.str().empty()){
            PZError<<std::endl<<sout.str()<<std::endl;
#ifdef PZ_LOG
            LOGPZ_FATAL(logger,sout.str().c_str());
#endif
            DebugStop();
        }
        #endif
        //if the point is singular, the blend factor and its derivatives should be zero
        if(!CheckProjectionForSingularity(side,xiVec)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
            blendFactor = 0;
            for(int i = 0; i < blendFactorDxi.size(); i++) blendFactorDxi[i] = 0;
            return;
        }
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        const T &xi = xiVec[0];
        const T &eta = xiVec[1];
        const T &zeta = xiVec[2];
        switch(side){
            case  0:
            case  1:
            case  2:
            case  3:
            case  4:
            case  5:
                blendFactor = 0;
                return;
            case  6:
                blendFactor = 0.5*(1.-zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 - zeta);
                blendFactorDxi[2] = -0.5*((1 - eta)*(1 - eta));
                return;
            case  7:
                blendFactor = 0.5*(1.-zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[1] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[2] =-0.5*((eta + xi)*(eta + xi));
                return;
            case  8:
                blendFactor = 0.5*(1.-zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] =-1.*(1 - xi)*(1 - zeta);
                blendFactorDxi[1] =0;
                blendFactorDxi[2] =-0.5*((1 - xi)*(1 - xi));
                return;
            case  9:
                blendFactor = 1. - xi - eta;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 10:
                blendFactor = xi;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 11:
                blendFactor = eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 12:
                blendFactor = 0.5*(1.+zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((1 - eta)*(1 - eta));
                return;
            case 13:
                blendFactor = 0.5*(1.+zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[1] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((eta + xi)*(eta + xi));
                return;
            case 14:
                blendFactor = 0.5*(1.+zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] = -1.*(1 - xi)*(1 + zeta);
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5*((1 - xi)*(1 - xi));
                return;
            case 15:
                blendFactor = 0.5*(1.-zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = -0.5;
                return;
            case 16:
                blendFactor = 1.-eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 17:
                blendFactor = xi+eta;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 18:
                blendFactor = 1.-xi;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 19:
                blendFactor = 0.5*(1.+zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5;
                return;
        }
    }